

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O0

double memUsed(void)

{
  return 0.0;
}

Assistant:

inline double memUsed() {
	return 0;
	/* char name[256]; */
	/* sprintf(name, "/proc/%d/statm", getpid()); */
	/* FILE* in = fopen(name, "rb"); */
	/* if (in == NULL) return 0; */
	/* int value; */
	/* rassert(fscanf(in, "%d", &value) == 1); */
	/* fclose(in); */
	/* return (double) value * getpagesize() / 1048576; */
}